

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O1

void CTcMain::tc_err_init(size_t param_stack_size,CResLoader *res_loader)

{
  FILE *__stream;
  
  err_init(0x400);
  if (((err_refs_ == 0) && (err_no_extern_messages_ == 0)) && (tc_messages == tc_messages_english))
  {
    __stream = (FILE *)CResLoader::open_res_file(res_loader,"t3make.msg",(char *)0x0,"XMSG");
    if (__stream == (FILE *)0x0) {
      err_no_extern_messages_ = 0;
    }
    else {
      err_load_message_file
                ((osfildef *)__stream,&tc_messages,&tc_message_count,tc_messages_english,
                 tc_message_count_english);
      fclose(__stream);
    }
  }
  err_refs_ = err_refs_ + 1;
  return;
}

Assistant:

void CTcMain::tc_err_init(size_t param_stack_size,
                          CResLoader *res_loader)
{
    /* initialize the error stack */
    err_init(1024);

    /* if this is the first initializer, set things up */
    if (err_refs_ == 0)
    {
        /* if we haven't loaded external compiler messages, load them */
        if (!err_no_extern_messages_
            && tc_messages == &tc_messages_english[0])
        {
            osfildef *fp;
            
            /* try finding a message file */
            fp = res_loader->open_res_file("t3make.msg", 0, "XMSG");
            if (fp != 0)
            {
                /* try loading it */
                err_load_message_file(fp, &tc_messages, &tc_message_count,
                                      &tc_messages_english[0],
                                      tc_message_count_english);
                
                /* done with the file */
                osfcls(fp);
            }
            else
            {
                /* note the failure, so we don't try again */
                err_no_extern_messages_ = FALSE;
            }
        }
    }

    /* count the reference depth */
    ++err_refs_;
}